

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O3

void Cmd_dumplinktable(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  undefined8 in_R9;
  int iVar4;
  ulong uVar5;
  
  uVar2 = (ulong)(uint)Displacements.size;
  if (1 < Displacements.size) {
    iVar3 = 1;
    uVar5 = uVar2;
    do {
      if (1 < (int)uVar2) {
        iVar4 = 1;
        do {
          iVar1 = (int)uVar2 * iVar4 + iVar3;
          Printf("%c%c(%6d, %6d)",0x1c,(ulong)(Displacements.data.Array[iVar1].indirect + 0x43),
                 (ulong)(uint)(int)Displacements.data.Array[iVar1].pos.X,
                 (ulong)(uint)(int)Displacements.data.Array[iVar1].pos.Y,in_R9,uVar5);
          iVar4 = iVar4 + 1;
          uVar2 = (ulong)(uint)Displacements.size;
        } while (iVar4 < Displacements.size);
      }
      Printf("\n");
      iVar3 = iVar3 + 1;
      uVar2 = (ulong)(uint)Displacements.size;
    } while (iVar3 < Displacements.size);
  }
  return;
}

Assistant:

CCMD(dumplinktable)
{
	for (int x = 1; x < Displacements.size; x++)
	{
		for (int y = 1; y < Displacements.size; y++)
		{
			FDisplacement &disp = Displacements(x, y);
			Printf("%c%c(%6d, %6d)", TEXTCOLOR_ESCAPE, 'C' + disp.indirect, int(disp.pos.X), int(disp.pos.Y));
		}
		Printf("\n");
	}
}